

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,Point2f *u)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  Transform *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Point3f local_94;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Float local_48;
  Float FStack_44;
  Float FStack_40;
  Float FStack_3c;
  Point3fi local_38;
  undefined1 extraout_var [60];
  
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  local_78._0_4_ = auVar6._0_4_;
  auVar6 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0));
  local_88 = vsqrtss_avx(auVar6,auVar6);
  fVar12 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  local_48 = this->radius;
  FStack_44 = local_48;
  FStack_40 = local_48;
  FStack_3c = local_48;
  local_58 = cosf(fVar12);
  uStack_54 = extraout_XMM0_Db;
  uStack_50 = extraout_XMM0_Dc;
  uStack_4c = extraout_XMM0_Dd;
  auVar10._0_4_ = sinf(fVar12);
  auVar10._4_60_ = extraout_var;
  local_94.super_Tuple3<pbrt::Point3,_float>.z = local_48 * (float)local_78._0_4_ + 0.0;
  auVar6._4_4_ = uStack_54;
  auVar6._0_4_ = local_58;
  auVar6._8_4_ = uStack_50;
  auVar6._12_4_ = uStack_4c;
  auVar6 = vinsertps_avx(auVar6,auVar10._0_16_,0x10);
  auVar7._0_4_ = local_48 * auVar6._0_4_ * (float)local_88._0_4_ + 0.0;
  auVar7._4_4_ = FStack_44 * auVar6._4_4_ * (float)local_88._0_4_ + 0.0;
  auVar7._8_4_ = FStack_40 * auVar6._8_4_ * (float)local_88._0_4_ + 0.0;
  auVar7._12_4_ = FStack_3c * auVar6._12_4_ * (float)local_88._0_4_ + 0.0;
  auVar15._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar15._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar15._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar15._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar6 = vmovshdup_avx(auVar15);
  auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_94.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)local_94.super_Tuple3<pbrt::Point3,_float>.z));
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  fVar12 = this->radius / auVar6._0_4_;
  local_94.super_Tuple3<pbrt::Point3,_float>.z =
       local_94.super_Tuple3<pbrt::Point3,_float>.z * fVar12;
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar8._0_4_ = auVar7._0_4_ * fVar12;
  auVar8._4_4_ = auVar7._4_4_ * fVar12;
  auVar8._8_4_ = auVar7._8_4_ * fVar12;
  auVar8._12_4_ = auVar7._12_4_ * fVar12;
  auVar20._4_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._8_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._12_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15 = vmovshdup_avx(auVar8);
  local_94.super_Tuple3<pbrt::Point3,_float>.y = auVar15._0_4_;
  auVar6 = vandps_avx(auVar8,auVar14);
  auVar7 = vandps_avx(auVar20,auVar14);
  auVar5._8_4_ = 0x34a00003;
  auVar5._0_8_ = 0x34a0000334a00003;
  auVar5._12_4_ = 0x34a00003;
  auVar6 = vmulps_avx512vl(auVar6,auVar5);
  local_68.z = auVar7._0_4_ * 2.980233e-07;
  local_68._0_8_ = vmovlps_avx(auVar6);
  this_00 = this->renderFromObject;
  bVar4 = this->reverseOrientation;
  uVar3 = *(undefined8 *)(this_00->mInv).m[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(this_00->mInv).m[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(this_00->mInv).m[2];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_94.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this_00->mInv).m[1][2])),auVar8,
                           ZEXT416((uint)(this_00->mInv).m[0][2]));
  auVar9._4_4_ = auVar8._0_4_;
  auVar9._0_4_ = auVar8._0_4_;
  auVar9._8_4_ = auVar8._0_4_;
  auVar9._12_4_ = auVar8._0_4_;
  auVar5 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_94.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this_00->mInv).m[2][2]));
  auVar16._0_4_ = local_94.super_Tuple3<pbrt::Point3,_float>.y * (float)uVar3;
  auVar16._4_4_ = auVar15._4_4_ * (float)((ulong)uVar3 >> 0x20);
  auVar16._8_4_ = auVar15._8_4_ * 0.0;
  auVar16._12_4_ = auVar15._12_4_ * 0.0;
  auVar6 = vfmadd213ps_fma(auVar9,auVar19,auVar16);
  auVar7 = vfmadd231ps_fma(auVar6,auVar20,auVar21);
  fVar13 = auVar5._0_4_;
  auVar17._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar17._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar17._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar17._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar6 = vhaddps_avx(auVar17,auVar17);
  auVar6 = ZEXT416((uint)(auVar6._0_4_ + fVar13 * fVar13));
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  fVar12 = auVar6._0_4_;
  auVar18._4_4_ = fVar12;
  auVar18._0_4_ = fVar12;
  auVar18._8_4_ = fVar12;
  auVar18._12_4_ = fVar12;
  auVar6 = vdivps_avx(auVar7,auVar18);
  local_88 = auVar6;
  if (bVar4 != false) {
    local_88._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    local_88._8_4_ = auVar6._8_4_ ^ 0x80000000;
    local_88._12_4_ = auVar6._12_4_ ^ 0x80000000;
  }
  local_78._0_4_ =
       (uint)(bVar4 & 1) * (int)-(fVar13 / fVar12) +
       (uint)!(bool)(bVar4 & 1) * (int)(fVar13 / fVar12);
  local_78._4_12_ = auVar5._4_12_;
  local_94.super_Tuple3<pbrt::Point3,_float>.x = auVar8._0_4_;
  Point3fi::Point3fi(&local_38,&local_94,(Vector3f *)&local_68);
  Transform::operator()((Point3fi *)__return_storage_ptr__,this_00,&local_38);
  fVar12 = this->zMax;
  fVar13 = this->phiMax;
  fVar1 = this->radius;
  fVar2 = this->zMin;
  __return_storage_ptr__->set = true;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar11;
  uVar3 = vmovlps_avx(local_88);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_78._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar11;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar13 * fVar1 * (fVar12 - fVar2));
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(const Point2f &u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}